

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aec_core.cc
# Opt level: O0

void webrtc::WebRtcAec_FreeAec(AecCore *aec)

{
  int local_14;
  int i;
  AecCore *aec_local;
  
  if (aec != (AecCore *)0x0) {
    WebRtc_FreeBuffer(aec->nearFrBuf);
    WebRtc_FreeBuffer(aec->outFrBuf);
    for (local_14 = 0; local_14 < 2; local_14 = local_14 + 1) {
      WebRtc_FreeBuffer(aec->nearFrBufH[local_14]);
      WebRtc_FreeBuffer(aec->outFrBufH[local_14]);
    }
    WebRtc_FreeBuffer(aec->far_time_buf);
    WebRtc_FreeDelayEstimator(aec->delay_estimator);
    WebRtc_FreeDelayEstimatorFarend(aec->delay_estimator_farend);
    if (aec != (AecCore *)0x0) {
      operator_delete(aec);
    }
  }
  return;
}

Assistant:

void WebRtcAec_FreeAec(AecCore* aec) {
  int i;
  if (aec == NULL) {
    return;
  }

  WebRtc_FreeBuffer(aec->nearFrBuf);
  WebRtc_FreeBuffer(aec->outFrBuf);

  for (i = 0; i < NUM_HIGH_BANDS_MAX; ++i) {
    WebRtc_FreeBuffer(aec->nearFrBufH[i]);
    WebRtc_FreeBuffer(aec->outFrBufH[i]);
  }

  WebRtc_FreeBuffer(aec->far_time_buf);

  RTC_AEC_DEBUG_WAV_CLOSE(aec->farFile);
  RTC_AEC_DEBUG_WAV_CLOSE(aec->nearFile);
  RTC_AEC_DEBUG_WAV_CLOSE(aec->outFile);
  RTC_AEC_DEBUG_WAV_CLOSE(aec->outLinearFile);
  RTC_AEC_DEBUG_RAW_CLOSE(aec->e_fft_file);

  WebRtc_FreeDelayEstimator(aec->delay_estimator);
  WebRtc_FreeDelayEstimatorFarend(aec->delay_estimator_farend);

  delete aec;
}